

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O1

bool __thiscall
crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::split_node
          (tree_clusterizer<crnlib::vec<6U,_float>_> *this,
          priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
          *node_queue,uint *end_node,task_pool *pTask_pool)

{
  uint uVar1;
  pointer pNVar2;
  vq_node *pvVar3;
  vec<6U,_float> *pvVar4;
  VectorInfo *pVVar5;
  vec<6U,_float> *pvVar6;
  vq_node *pvVar7;
  int iVar8;
  int iVar9;
  undefined8 uVar10;
  task_pool *this_00;
  tree_clusterizer<crnlib::vec<6U,_float>_> *ptVar11;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  *this_01;
  uint i_4;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  executable_task *pObj;
  ulong uVar15;
  long lVar16;
  long lVar17;
  value_type *pvVar18;
  uint task;
  uint64 uVar19;
  ulong uVar20;
  uint uVar21;
  value_type *pvVar22;
  undefined8 *puVar23;
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *pvVar24;
  uint i_2;
  uint x;
  uint i_15;
  long lVar25;
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *pvVar26;
  uint i_14;
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *pvVar27;
  uint uVar28;
  ulong uVar29;
  vq_node *pvVar30;
  ulong uVar31;
  double dVar32;
  undefined1 auVar33 [16];
  float dist2;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  double sum;
  undefined1 auVar39 [16];
  float dist2_3;
  double dVar40;
  vec<6U,_float> axis;
  vec<6U,_float> new_left_child;
  vec<6U,_float> right_child;
  vec<6U,_float> left_child;
  vec<6U,_float> result_6;
  vec<6U,_float> furthest;
  vec<6U,_float> new_right_child;
  vec<6U,_float> result;
  vec<6U,_float> opposite;
  float local_20c;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8 [2];
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  float local_1cc;
  task_pool *local_1c8;
  tree_clusterizer<crnlib::vec<6U,_float>_> *local_1c0;
  vq_node *local_1b8;
  uint local_1ac;
  undefined1 local_1a8 [40];
  float afStack_180 [6];
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *local_168;
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *local_160;
  ulong local_158;
  float local_150 [6];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  uint *local_120;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  *local_118;
  vq_node *local_110;
  float local_108 [8];
  undefined1 local_e8 [16];
  value_type local_d8;
  undefined1 *local_d0;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pNVar2 = (node_queue->c).
           super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pNVar2 != (node_queue->c).
                super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    uVar12 = pNVar2->m_index;
    pvVar3 = (this->m_nodes).m_p;
    pvVar30 = pvVar3 + uVar12;
    if (pvVar3[uVar12].m_alternative == true) {
      pvVar30->m_alternative = false;
    }
    if ((0.0 < pvVar30->m_variance) && (pvVar30->m_begin + 1 != pvVar30->m_end)) {
      local_1c8 = pTask_pool;
      std::
      priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
      ::pop(node_queue);
      if (pvVar30->m_processed == true) {
        if (pvVar30->m_unsplittable != false) {
          return true;
        }
        uVar12 = pvVar30->m_left;
        pvVar3 = (this->m_nodes).m_p;
        uVar28 = *end_node;
        if (uVar28 != uVar12) {
          lVar16 = 0;
          do {
            pvVar3[uVar28].m_centroid.m_s[lVar16] = pvVar3[uVar12].m_centroid.m_s[lVar16];
            lVar16 = lVar16 + 1;
          } while (lVar16 != 6);
        }
        *(undefined4 *)((long)&pvVar3[uVar28].m_codebook_index + 3) =
             *(undefined4 *)((long)&pvVar3[uVar12].m_codebook_index + 3);
        uVar19 = pvVar3[uVar12].m_total_weight;
        fVar35 = pvVar3[uVar12].m_variance;
        uVar1 = pvVar3[uVar12].m_begin;
        iVar13 = pvVar3[uVar12].m_left;
        iVar8 = pvVar3[uVar12].m_right;
        iVar9 = pvVar3[uVar12].m_codebook_index;
        pvVar3[uVar28].m_end = pvVar3[uVar12].m_end;
        pvVar3[uVar28].m_left = iVar13;
        pvVar3[uVar28].m_right = iVar8;
        pvVar3[uVar28].m_codebook_index = iVar9;
        pvVar3[uVar28].m_total_weight = uVar19;
        pvVar3[uVar28].m_variance = fVar35;
        pvVar3[uVar28].m_begin = uVar1;
        (this->m_nodes).m_p[*end_node].m_alternative = true;
        local_d8.m_variance = (this->m_nodes).m_p[*end_node].m_variance;
        local_d8.m_index = *end_node;
        std::
        priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
        ::push(node_queue,&local_d8);
        uVar1 = *end_node;
        *end_node = uVar1 + 1;
        pvVar30->m_left = uVar1;
        uVar12 = pvVar30->m_right;
        pvVar3 = (this->m_nodes).m_p;
        uVar28 = *end_node;
        if (uVar28 != uVar12) {
          lVar16 = 0;
          do {
            pvVar3[uVar28].m_centroid.m_s[lVar16] = pvVar3[uVar12].m_centroid.m_s[lVar16];
            lVar16 = lVar16 + 1;
          } while (lVar16 != 6);
        }
        *(undefined4 *)((long)&pvVar3[uVar28].m_codebook_index + 3) =
             *(undefined4 *)((long)&pvVar3[uVar12].m_codebook_index + 3);
        uVar19 = pvVar3[uVar12].m_total_weight;
        fVar35 = pvVar3[uVar12].m_variance;
        uVar1 = pvVar3[uVar12].m_begin;
        iVar13 = pvVar3[uVar12].m_left;
        iVar8 = pvVar3[uVar12].m_right;
        iVar9 = pvVar3[uVar12].m_codebook_index;
        pvVar3[uVar28].m_end = pvVar3[uVar12].m_end;
        pvVar3[uVar28].m_left = iVar13;
        pvVar3[uVar28].m_right = iVar8;
        pvVar3[uVar28].m_codebook_index = iVar9;
        pvVar3[uVar28].m_total_weight = uVar19;
        pvVar3[uVar28].m_variance = fVar35;
        pvVar3[uVar28].m_begin = uVar1;
        (this->m_nodes).m_p[*end_node].m_alternative = true;
        local_d8.m_variance = (this->m_nodes).m_p[*end_node].m_variance;
        local_d8.m_index = *end_node;
        std::
        priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
        ::push(node_queue,&local_d8);
        uVar1 = *end_node;
        *end_node = uVar1 + 1;
        pvVar30->m_right = uVar1;
        return true;
      }
      pvVar30->m_processed = true;
      local_1ac = 1;
      if ((local_1c8 != (task_pool *)0x0) &&
         (uVar12 = pvVar30->m_end - pvVar30->m_begin, 0x3ff < uVar12)) {
        uVar12 = uVar12 >> 9;
        local_1ac = local_1c8->m_num_threads + 1;
        if (uVar12 < local_1ac) {
          local_1ac = uVar12;
        }
      }
      local_138 = 0;
      uStack_130 = 0;
      local_128 = 0;
      uVar14 = (ulong)pvVar30->m_begin;
      if (pvVar30->m_begin < pvVar30->m_end) {
        fVar35 = -1.0;
        do {
          pvVar4 = this->m_vectors + (this->m_vectorsInfo).m_p[uVar14].index;
          fVar34 = 0.0;
          lVar16 = 0;
          do {
            fVar38 = pvVar4->m_s[lVar16] - (pvVar30->m_centroid).m_s[lVar16];
            fVar34 = fVar34 + fVar38 * fVar38;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 6);
          if (fVar35 < fVar34) {
            local_128 = *(undefined8 *)(pvVar4->m_s + 4);
            local_138 = *(undefined8 *)pvVar4->m_s;
            uStack_130 = *(undefined8 *)(pvVar4->m_s + 2);
            fVar35 = fVar34;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != pvVar30->m_end);
      }
      uVar14 = (ulong)pvVar30->m_begin;
      if (pvVar30->m_begin < pvVar30->m_end) {
        fVar35 = -1.0;
        do {
          pvVar4 = this->m_vectors + (this->m_vectorsInfo).m_p[uVar14].index;
          fVar34 = 0.0;
          lVar16 = 0;
          do {
            fVar38 = pvVar4->m_s[lVar16] - *(float *)((long)&local_138 + lVar16 * 4);
            fVar34 = fVar34 + fVar38 * fVar38;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 6);
          if (fVar35 < fVar34) {
            local_38 = *(undefined8 *)(pvVar4->m_s + 4);
            local_48 = *(undefined8 *)pvVar4->m_s;
            uStack_40 = *(undefined8 *)(pvVar4->m_s + 2);
            fVar35 = fVar34;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != pvVar30->m_end);
      }
      lVar16 = 0;
      do {
        (&local_d8.m_index)[lVar16] =
             (uint)(*(float *)((long)&local_138 + lVar16 * 4) + (pvVar30->m_centroid).m_s[lVar16]);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 6);
      lVar16 = 0;
      do {
        afStack_180[lVar16 + -2] = (float)(&local_d8.m_index)[lVar16] * 0.5;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 6);
      lVar16 = 0;
      do {
        (&local_d8.m_index)[lVar16] =
             (uint)(*(float *)((long)&local_48 + lVar16 * 4) + (pvVar30->m_centroid).m_s[lVar16]);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 6);
      local_120 = end_node;
      local_118 = node_queue;
      lVar16 = 0;
      do {
        *(float *)(local_1a8 + lVar16 * 4) = (float)(&local_d8.m_index)[lVar16] * 0.5;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 6);
      uVar12 = pvVar30->m_begin;
      uVar14 = (ulong)uVar12;
      uVar28 = pvVar30->m_end;
      if (uVar12 + 2 < uVar28) {
        pvVar18 = &local_d8;
        memset(pvVar18,0,0x90);
        if (uVar12 < uVar28) {
          pvVar4 = this->m_vectors;
          pVVar5 = (this->m_vectorsInfo).m_p;
          do {
            uVar12 = pVVar5[uVar14].index;
            lVar16 = 0;
            do {
              *(float *)((long)&local_208 + lVar16 * 4) =
                   pvVar4[uVar12].m_s[lVar16] - (pvVar30->m_centroid).m_s[lVar16];
              lVar16 = lVar16 + 1;
            } while (lVar16 != 6);
            uVar12 = pVVar5[uVar14].weight;
            lVar16 = 0;
            do {
              *(float *)((long)&local_1e8 + lVar16 * 4) =
                   *(float *)((long)&local_208 + lVar16 * 4) * (float)uVar12;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 6);
            lVar16 = 0;
            puVar23 = &local_1e8;
            pvVar22 = &local_d8;
            do {
              fVar35 = *(float *)((long)&local_208 + lVar16 * 4);
              lVar25 = -6;
              do {
                (&pvVar22[3].m_index)[lVar25] =
                     (uint)(*(float *)((long)puVar23 + lVar25 * 4 + 0x18) * fVar35 +
                           (float)(&pvVar22[3].m_index)[lVar25]);
                lVar25 = lVar25 + 1;
              } while (lVar16 + lVar25 != 0);
              lVar16 = lVar16 + 1;
              pvVar22 = (value_type *)&pvVar22[3].m_variance;
              puVar23 = (undefined8 *)((long)puVar23 + 4);
            } while (lVar16 != 6);
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar28);
        }
        uVar14 = pvVar30->m_total_weight;
        lVar16 = 0x90;
        lVar25 = 0;
        do {
          lVar17 = 0;
          pvVar22 = pvVar18;
          do {
            fVar35 = (float)pvVar22->m_index / (float)uVar14;
            pvVar22->m_index = (uint)fVar35;
            *(float *)((long)&pvVar18->m_index + lVar17) = fVar35;
            pvVar22 = (value_type *)&pvVar22->m_variance;
            lVar17 = lVar17 + 0x18;
          } while (lVar16 != lVar17);
          lVar25 = lVar25 + 1;
          pvVar18 = (value_type *)&pvVar18[3].m_variance;
          lVar16 = lVar16 + -0x18;
        } while (lVar25 != 6);
        lVar16 = 1;
        auVar33 = _DAT_001b10a0;
        do {
          if (SUB164(auVar33 ^ _DAT_001b10b0,4) == -0x80000000 &&
              SUB164(auVar33 ^ _DAT_001b10b0,0) < -0x7ffffffa) {
            (&local_20c)[lVar16] = 1.0;
            *(undefined4 *)((long)&local_208 + lVar16 * 4) = 0x3f800000;
          }
          lVar25 = auVar33._8_8_;
          auVar33._0_8_ = auVar33._0_8_ + (long)DAT_001b4670;
          auVar33._8_8_ = lVar25 + DAT_001b4670._8_8_;
          lVar16 = lVar16 + 2;
        } while (lVar16 != 7);
        iVar13 = 0;
        do {
          lVar16 = 0;
          pvVar18 = &local_d8;
          fVar35 = 0.0;
          do {
            fVar34 = 0.0;
            lVar25 = 0;
            do {
              fVar34 = fVar34 + *(float *)((long)&local_208 + lVar25 * 4) *
                                (float)(&pvVar18->m_index)[lVar25];
              lVar25 = lVar25 + 1;
            } while (lVar25 != 6);
            *(float *)((long)&local_1e8 + lVar16 * 4) = fVar34;
            fVar38 = fVar34;
            if ((lVar16 != 0) && (fVar38 = fVar35, fVar35 <= fVar34)) {
              fVar38 = fVar34;
            }
            lVar16 = lVar16 + 1;
            pvVar18 = pvVar18 + 3;
            fVar35 = fVar38;
          } while (lVar16 != 6);
          if ((fVar38 != 0.0) || (NAN(fVar38))) {
            lVar16 = 0;
            do {
              *(float *)((long)&local_1e8 + lVar16 * 4) =
                   *(float *)((long)&local_1e8 + lVar16 * 4) * (1.0 / fVar38);
              lVar16 = lVar16 + 1;
            } while (lVar16 != 6);
          }
          local_1f8[0] = local_1d8;
          local_208 = local_1e8;
          uVar10 = local_208;
          uStack_200 = uStack_1e0;
          iVar13 = iVar13 + 1;
        } while (iVar13 != 10);
        local_208._0_4_ = (float)local_1e8;
        dVar32 = (double)((float)local_208 * (float)local_208);
        lVar16 = 1;
        do {
          fVar35 = *(float *)((long)&local_208 + lVar16 * 4);
          dVar32 = dVar32 + (double)(fVar35 * fVar35);
          lVar16 = lVar16 + 1;
        } while (lVar16 != 6);
        local_208 = uVar10;
        if ((dVar32 != 0.0) || (NAN(dVar32))) {
          if (dVar32 < 0.0) {
            dVar32 = sqrt(dVar32);
          }
          else {
            dVar32 = SQRT(dVar32);
          }
          lVar16 = 0;
          do {
            *(float *)((long)&local_208 + lVar16 * 4) =
                 *(float *)((long)&local_208 + lVar16 * 4) * (float)(1.0 / dVar32);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 6);
        }
        dVar40 = 0.0;
        local_1e8 = 0;
        uStack_1e0 = 0;
        local_1d8 = 0;
        local_108[4] = 0.0;
        local_108[5] = 0.0;
        local_108[0] = 0.0;
        local_108[1] = 0.0;
        local_108[2] = 0.0;
        local_108[3] = 0.0;
        uVar14 = (ulong)pvVar30->m_begin;
        uVar12 = pvVar30->m_end;
        dVar32 = 0.0;
        if (pvVar30->m_begin < uVar12) {
          pVVar5 = (this->m_vectorsInfo).m_p;
          pvVar4 = this->m_vectors;
          pvVar6 = (this->m_weightedVectors).m_p;
          dVar40 = 0.0;
          dVar32 = 0.0;
          do {
            uVar28 = pVVar5[uVar14].weight;
            uVar21 = pVVar5[uVar14].index;
            lVar16 = 0;
            do {
              local_150[lVar16] = pvVar4[uVar21].m_s[lVar16] - (pvVar30->m_centroid).m_s[lVar16];
              lVar16 = lVar16 + 1;
            } while (lVar16 != 6);
            fVar35 = local_150[0] * (float)local_208;
            lVar16 = 1;
            do {
              fVar35 = fVar35 + local_150[lVar16] * *(float *)((long)&local_208 + lVar16 * 4);
              lVar16 = lVar16 + 1;
            } while (lVar16 != 6);
            if (0.0 <= fVar35) {
              lVar16 = 0;
              do {
                local_108[lVar16] = pvVar6[uVar21].m_s[lVar16] + local_108[lVar16];
                lVar16 = lVar16 + 1;
              } while (lVar16 != 6);
              dVar32 = dVar32 + (double)uVar28;
            }
            else {
              lVar16 = 0;
              do {
                *(float *)((long)&local_1e8 + lVar16 * 4) =
                     pvVar6[uVar21].m_s[lVar16] + *(float *)((long)&local_1e8 + lVar16 * 4);
                lVar16 = lVar16 + 1;
              } while (lVar16 != 6);
              dVar40 = dVar40 + (double)uVar28;
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar12);
        }
        if ((0.0 < dVar40) && (0.0 < dVar32)) {
          lVar16 = 0;
          do {
            local_150[lVar16] = *(float *)((long)&local_1e8 + lVar16 * 4) * (float)(1.0 / dVar40);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 6);
          afStack_180[2] = local_150[4];
          afStack_180[3] = local_150[5];
          local_1a8._36_4_ = local_150[1];
          local_1a8._32_4_ = local_150[0];
          afStack_180[0] = local_150[2];
          afStack_180[1] = local_150[3];
          lVar16 = 0;
          do {
            local_150[lVar16] = local_108[lVar16] * (float)(1.0 / dVar32);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 6);
          local_1a8._16_4_ = local_150[4];
          local_1a8._20_4_ = local_150[5];
          local_1a8._4_4_ = local_150[1];
          local_1a8._0_4_ = local_150[0];
          local_1a8._8_4_ = local_150[2];
          local_1a8._12_4_ = local_150[3];
        }
      }
      pvVar26 = &this->m_vectorsInfoRight;
      local_1c0 = this;
      pvVar27 = &this->m_vectorsInfoLeft;
      local_e8._0_12_ = ZEXT812(0x501502f9);
      local_e8._12_4_ = 0;
      local_1cc = 0.0;
      iVar13 = 0;
      local_20c = 0.0;
      local_160 = pvVar26;
      local_168 = pvVar27;
      local_110 = pvVar30;
      do {
        ptVar11 = local_1c0;
        this_00 = local_1c8;
        local_1b8 = (vq_node *)CONCAT44(local_1b8._4_4_,iVar13);
        uVar12 = pvVar30->m_begin;
        uVar14 = (ulong)uVar12;
        local_1f8[0]._0_4_ = 0.0;
        local_1f8[0]._4_4_ = 0.0;
        local_208._0_4_ = 0.0;
        local_208._4_4_ = 0;
        uStack_200._0_4_ = 0.0;
        uStack_200._4_4_ = 0.0;
        local_1d8._0_4_ = 0.0;
        local_1d8._4_4_ = 0.0;
        local_1e8._0_4_ = 0.0;
        local_1e8._4_4_ = 0.0;
        uStack_1e0._0_4_ = 0.0;
        uStack_1e0._4_4_ = 0.0;
        if (local_1ac < 2) {
          if (uVar12 < pvVar30->m_end) {
            dVar32 = 0.0;
            auVar37 = ZEXT816(0);
            uVar20 = 0;
            uVar31 = 0;
            uVar29 = uVar14;
            do {
              pVVar5 = (local_1c0->m_vectorsInfo).m_p;
              uVar28 = pVVar5[uVar14].index;
              fVar35 = 0.0;
              lVar16 = 0;
              do {
                fVar34 = afStack_180[lVar16 + -2] - local_1c0->m_vectors[uVar28].m_s[lVar16];
                fVar35 = fVar35 + fVar34 * fVar34;
                lVar16 = lVar16 + 1;
              } while (lVar16 != 6);
              fVar34 = 0.0;
              lVar16 = 0;
              do {
                fVar38 = *(float *)(local_1a8 + lVar16 * 4) -
                         local_1c0->m_vectors[uVar28].m_s[lVar16];
                fVar34 = fVar34 + fVar38 * fVar38;
                lVar16 = lVar16 + 1;
              } while (lVar16 != 6);
              if (fVar34 <= fVar35) {
                pvVar4 = (local_1c0->m_weightedVectors).m_p;
                lVar16 = 0;
                do {
                  *(float *)((long)&local_1e8 + lVar16 * 4) =
                       pvVar4[uVar28].m_s[lVar16] + *(float *)((long)&local_1e8 + lVar16 * 4);
                  lVar16 = lVar16 + 1;
                } while (lVar16 != 6);
                dVar32 = dVar32 + (local_1c0->m_weightedDotProducts).m_p[uVar28];
                uVar20 = uVar20 + pVVar5[uVar14].weight;
                pvVar24 = pvVar26;
                uVar28 = uVar12 + 1;
                uVar21 = uVar12;
              }
              else {
                pvVar4 = (local_1c0->m_weightedVectors).m_p;
                lVar16 = 0;
                do {
                  *(float *)((long)&local_208 + lVar16 * 4) =
                       pvVar4[uVar28].m_s[lVar16] + *(float *)((long)&local_208 + lVar16 * 4);
                  lVar16 = lVar16 + 1;
                } while (lVar16 != 6);
                auVar37._0_8_ = auVar37._0_8_ + (local_1c0->m_weightedDotProducts).m_p[uVar28];
                uVar31 = uVar31 + pVVar5[uVar14].weight;
                uVar21 = (uint)uVar29;
                uVar29 = (ulong)(uVar21 + 1);
                pvVar24 = pvVar27;
                uVar28 = uVar12;
              }
              uVar12 = uVar28;
              dVar40 = auVar37._0_8_;
              uVar28 = (uint)uVar29;
              pvVar24->m_p[uVar21] = pVVar5[uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar14 < pvVar30->m_end);
          }
          else {
            dVar40 = 0.0;
            uVar31 = 0;
            uVar20 = 0;
            dVar32 = 0.0;
            uVar28 = uVar12;
          }
        }
        else {
          local_d8 = (value_type)((long)local_1a8 + 0x20);
          local_d0 = local_1a8;
          local_c8 = pvVar30->m_begin;
          local_c4 = pvVar30->m_end;
          local_c0 = local_1ac;
          uVar19 = 0;
          local_158 = uVar14;
          do {
            pObj = (executable_task *)crnlib_malloc(0x28);
            pObj->_vptr_executable_task = (_func_int **)&PTR_execute_task_001de990;
            pObj[1]._vptr_executable_task = (_func_int **)ptVar11;
            pObj[2]._vptr_executable_task = (_func_int **)distance_comparison_task;
            pObj[3]._vptr_executable_task = (_func_int **)0x0;
            *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
            task_pool::queue_task(this_00,pObj,uVar19,&local_d8);
            uVar19 = uVar19 + 1;
          } while (uVar19 < local_c0);
          task_pool::join(this_00);
          uVar14 = (ulong)local_110->m_begin;
          pvVar26 = local_160;
          pvVar27 = local_168;
          pvVar30 = local_110;
          if (local_110->m_begin < local_110->m_end) {
            dVar32 = 0.0;
            auVar36 = ZEXT816(0);
            uVar15 = local_158 & 0xffffffff;
            uVar20 = 0;
            uVar31 = 0;
            uVar29 = local_158;
            do {
              pVVar5 = (local_1c0->m_vectorsInfo).m_p;
              uVar12 = pVVar5[uVar14].index;
              if ((local_1c0->m_vectorComparison).m_p[uVar14] == true) {
                pvVar4 = (local_1c0->m_weightedVectors).m_p;
                lVar16 = 0;
                do {
                  *(float *)((long)&local_208 + lVar16 * 4) =
                       pvVar4[uVar12].m_s[lVar16] + *(float *)((long)&local_208 + lVar16 * 4);
                  lVar16 = lVar16 + 1;
                } while (lVar16 != 6);
                auVar36._0_8_ = auVar36._0_8_ + (local_1c0->m_weightedDotProducts).m_p[uVar12];
                uVar31 = uVar31 + pVVar5[uVar14].weight;
                uVar12 = (uint)uVar29;
                uVar29 = (ulong)(uVar12 + 1);
                pvVar24 = local_168;
              }
              else {
                pvVar4 = (local_1c0->m_weightedVectors).m_p;
                lVar16 = 0;
                do {
                  *(float *)((long)&local_1e8 + lVar16 * 4) =
                       pvVar4[uVar12].m_s[lVar16] + *(float *)((long)&local_1e8 + lVar16 * 4);
                  lVar16 = lVar16 + 1;
                } while (lVar16 != 6);
                dVar32 = dVar32 + (local_1c0->m_weightedDotProducts).m_p[uVar12];
                uVar20 = uVar20 + pVVar5[uVar14].weight;
                uVar12 = (uint)uVar15;
                uVar15 = (ulong)(uVar12 + 1);
                pvVar24 = local_160;
              }
              dVar40 = auVar36._0_8_;
              uVar28 = (uint)uVar29;
              pvVar24->m_p[uVar12] = pVVar5[uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar14 < local_110->m_end);
          }
          else {
            dVar40 = 0.0;
            uVar31 = 0;
            uVar20 = 0;
            dVar32 = 0.0;
            uVar28 = (uint)local_158;
          }
        }
        this_01 = local_118;
        if ((uVar31 == 0) || (uVar20 == 0)) {
          pvVar30->m_unsplittable = true;
          iVar13 = 1;
        }
        else {
          fVar35 = (float)local_208 * (float)local_208;
          lVar16 = 1;
          do {
            fVar34 = *(float *)((long)&local_208 + lVar16 * 4);
            fVar35 = fVar35 + fVar34 * fVar34;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 6);
          fVar34 = (float)local_1e8 * (float)local_1e8;
          lVar16 = 1;
          do {
            fVar38 = *(float *)((long)&local_1e8 + lVar16 * 4);
            fVar34 = fVar34 + fVar38 * fVar38;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 6);
          lVar16 = 0;
          do {
            *(float *)((long)&local_208 + lVar16 * 4) =
                 *(float *)((long)&local_208 + lVar16 * 4) * (1.0 / (float)uVar31);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 6);
          local_20c = (float)(dVar40 - (double)(fVar35 / (float)uVar31));
          lVar16 = 0;
          do {
            *(float *)((long)&local_1e8 + lVar16 * 4) =
                 *(float *)((long)&local_1e8 + lVar16 * 4) * (1.0 / (float)uVar20);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 6);
          afStack_180[2] = (float)local_1f8[0];
          afStack_180[3] = local_1f8[0]._4_4_;
          local_1a8._32_4_ = (float)local_208;
          local_1a8._36_4_ = local_208._4_4_;
          afStack_180[0] = (float)uStack_200;
          afStack_180[1] = uStack_200._4_4_;
          local_1a8._0_4_ = (float)local_1e8;
          local_1a8._4_4_ = local_1e8._4_4_;
          local_1a8._8_4_ = (float)uStack_1e0;
          local_1a8._12_4_ = uStack_1e0._4_4_;
          local_1a8._16_4_ = (float)local_1d8;
          local_1a8._20_4_ = local_1d8._4_4_;
          local_1cc = (float)(dVar32 - (double)(fVar34 / (float)uVar20));
          fVar35 = local_20c + local_1cc;
          iVar13 = 0x23;
          if (1e-05 <= fVar35) {
            fVar34 = ((float)local_e8._0_4_ - fVar35) / fVar35;
            uVar12 = -(uint)(fVar34 < 1e-05);
            auVar39._0_4_ = local_e8._0_4_ & uVar12;
            auVar39._4_4_ = local_e8._4_4_;
            auVar39._8_4_ = local_e8._8_4_;
            auVar39._12_4_ = local_e8._12_4_;
            local_e8 = auVar39 | ZEXT416(~uVar12 & (uint)fVar35);
            iVar13 = 0;
            if (fVar34 < 1e-05) {
              iVar13 = 0x23;
            }
          }
        }
        if (iVar13 != 0) goto LAB_0018fa72;
        iVar13 = (int)local_1b8 + 1;
      } while (iVar13 != 0x400);
      iVar13 = 0x23;
LAB_0018fa72:
      if (iVar13 == 0x23) {
        uVar1 = *local_120;
        *local_120 = uVar1 + 1;
        pvVar30->m_left = uVar1;
        uVar1 = *local_120;
        *local_120 = uVar1 + 1;
        pvVar30->m_right = uVar1;
        local_d8.m_variance = local_20c;
        local_d8.m_index = pvVar30->m_left;
        std::
        priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
        ::push(local_118,&local_d8);
        local_d8.m_variance = local_1cc;
        local_d8.m_index = pvVar30->m_right;
        std::
        priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
        ::push(this_01,&local_d8);
        ptVar11 = local_1c0;
        uVar12 = pvVar30->m_left;
        pvVar7 = (local_1c0->m_nodes).m_p;
        pvVar3 = pvVar7 + uVar12;
        uVar14 = (ulong)(uint)pvVar30->m_right;
        local_1c8 = (task_pool *)(uVar14 * 0x40);
        local_1b8 = pvVar7 + uVar14;
        pvVar7[uVar12].m_begin = pvVar30->m_begin;
        pvVar7[uVar14].m_begin = uVar28;
        pvVar7[uVar12].m_end = uVar28;
        pvVar7[uVar14].m_end = pvVar30->m_end;
        memcpy((local_1c0->m_vectorsInfo).m_p + pvVar7[uVar12].m_begin,
               (local_1c0->m_vectorsInfoLeft).m_p + pvVar30->m_begin,
               (ulong)(pvVar7[uVar12].m_end - pvVar7[uVar12].m_begin) << 3);
        uVar12 = *(uint *)((long)(&pvVar7->m_centroid + 1) + (long)local_1c8 + 0xc);
        memcpy((ptVar11->m_vectorsInfo).m_p + uVar12,
               (ptVar11->m_vectorsInfoRight).m_p + pvVar30->m_begin,
               (ulong)(*(int *)((long)(&pvVar7->m_centroid + 1) + (long)local_1c8 + 0x10) - uVar12)
               << 3);
        if (pvVar3 != (vq_node *)(local_1a8 + 0x20)) {
          lVar16 = 0;
          do {
            (pvVar3->m_centroid).m_s[lVar16] = afStack_180[lVar16 + -2];
            lVar16 = lVar16 + 1;
          } while (lVar16 != 6);
        }
        pvVar3->m_total_weight = uVar31;
        pvVar3->m_variance = local_20c;
        if (local_1b8 != (vq_node *)local_1a8) {
          lVar16 = 0;
          do {
            (local_1b8->m_centroid).m_s[lVar16] = *(float *)(local_1a8 + lVar16 * 4);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 6);
        }
        local_1b8->m_total_weight = uVar20;
        local_1b8->m_variance = local_1cc;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool split_node(std::priority_queue<NodeInfo>& node_queue, uint& end_node, task_pool* pTask_pool = 0) {
    if (node_queue.empty())
      return false;

    vq_node& parent_node = m_nodes[node_queue.top().m_index];

    if (parent_node.m_alternative)
      parent_node.m_alternative = false;

    if (parent_node.m_variance <= 0.0f || parent_node.m_begin + 1 == parent_node.m_end)
      return false;

    node_queue.pop();

    if (parent_node.m_processed) {
      if (!parent_node.m_unsplittable) {
        m_nodes[end_node] = m_nodes[parent_node.m_left];
        m_nodes[end_node].m_alternative = true;
        node_queue.push(NodeInfo(end_node, m_nodes[end_node].m_variance));
        parent_node.m_left = end_node++;
        m_nodes[end_node] = m_nodes[parent_node.m_right];
        m_nodes[end_node].m_alternative = true;
        node_queue.push(NodeInfo(end_node, m_nodes[end_node].m_variance));
        parent_node.m_right = end_node++;
      }
      return true;
    }
    parent_node.m_processed = true;

    uint num_blocks = (parent_node.m_end - parent_node.m_begin) >> 9;
    uint num_tasks = num_blocks > 1 && pTask_pool ? math::minimum(num_blocks, pTask_pool->get_num_threads() + 1) : 1;

    VectorType furthest(0);
    double furthest_dist = -1.0f;

    for (uint i = parent_node.m_begin; i < parent_node.m_end; i++) {
      const VectorType& v = m_vectors[m_vectorsInfo[i].index];
      double dist = v.squared_distance(parent_node.m_centroid);
      if (dist > furthest_dist) {
        furthest_dist = dist;
        furthest = v;
      }
    }

    VectorType opposite;
    double opposite_dist = -1.0f;

    for (uint i = parent_node.m_begin; i < parent_node.m_end; i++) {
      const VectorType& v = m_vectors[m_vectorsInfo[i].index];
      double dist = v.squared_distance(furthest);
      if (dist > opposite_dist) {
        opposite_dist = dist;
        opposite = v;
      }
    }

    VectorType left_child((furthest + parent_node.m_centroid) * .5f);
    VectorType right_child((opposite + parent_node.m_centroid) * .5f);

    if (parent_node.m_begin + 2 < parent_node.m_end) {
      const uint N = VectorType::num_elements;

      matrix<N, N, float> covar;
      covar.clear();

      for (uint i = parent_node.m_begin; i < parent_node.m_end; i++) {
        const VectorType& v = m_vectors[m_vectorsInfo[i].index] - parent_node.m_centroid;
        const VectorType w = v * (float)m_vectorsInfo[i].weight;
        for (uint x = 0; x < N; x++) {
          for (uint y = x; y < N; y++)
            covar[x][y] = covar[x][y] + v[x] * w[y];
        }
      }

      float divider = (float)parent_node.m_total_weight;
      for (uint x = 0; x < N; x++) {
        for (uint y = x; y < N; y++) {
          covar[x][y] /= divider;
          covar[y][x] = covar[x][y];
        }
      }

      VectorType axis(1.0f);
      // Starting with an estimate of the principle axis should work better, but doesn't in practice?
      //left_child - right_child);
      //axis.normalize();

      for (uint iter = 0; iter < 10; iter++) {
        VectorType x;

        double max_sum = 0;

        for (uint i = 0; i < N; i++) {
          double sum = 0;

          for (uint j = 0; j < N; j++)
            sum += axis[j] * covar[i][j];

          x[i] = (float)sum;

          max_sum = i ? math::maximum(max_sum, sum) : sum;
        }

        if (max_sum != 0.0f)
          x *= (float)(1.0f / max_sum);

        axis = x;
      }

      axis.normalize();

      VectorType new_left_child(0.0f);
      VectorType new_right_child(0.0f);

      double left_weight = 0.0f;
      double right_weight = 0.0f;

      for (uint i = parent_node.m_begin; i < parent_node.m_end; i++) {
        const VectorInfo& vectorInfo = m_vectorsInfo[i];
        const float weight = (float)vectorInfo.weight;
        double t = (m_vectors[vectorInfo.index] - parent_node.m_centroid) * axis;
        if (t < 0.0f) {
          new_left_child += m_weightedVectors[vectorInfo.index];
          left_weight += weight;
        } else {
          new_right_child += m_weightedVectors[vectorInfo.index];
          right_weight += weight;
        }
      }

      if ((left_weight > 0.0f) && (right_weight > 0.0f)) {
        left_child = new_left_child * (float)(1.0f / left_weight);
        right_child = new_right_child * (float)(1.0f / right_weight);
      }
    }

    uint64 left_weight = 0;
    uint64 right_weight = 0;

    uint left_info_index = 0;
    uint right_info_index = 0;

    float prev_total_variance = 1e+10f;

    float left_variance = 0.0f;
    float right_variance = 0.0f;

    // FIXME: Excessive upper limit
    const uint cMaxLoops = 1024;
    for (uint total_loops = 0; total_loops < cMaxLoops; total_loops++) {
      left_info_index = right_info_index = parent_node.m_begin;

      VectorType new_left_child(cClear);
      VectorType new_right_child(cClear);

      double left_ttsum = 0.0f;
      double right_ttsum = 0.0f;

      left_weight = 0;
      right_weight = 0;

      if (num_tasks > 1) {
        distance_comparison_task_params params;
        params.left_child = &left_child;
        params.right_child = &right_child;
        params.begin = parent_node.m_begin;
        params.end = parent_node.m_end;
        params.num_tasks = num_tasks;

        for (uint task = 0; task < params.num_tasks; task++)
          pTask_pool->queue_object_task(this, &tree_clusterizer::distance_comparison_task, task, &params);
        pTask_pool->join();

        for (uint i = parent_node.m_begin; i < parent_node.m_end; i++) {
          const VectorInfo& vectorInfo = m_vectorsInfo[i];
          if (m_vectorComparison[i]) {
            new_left_child += m_weightedVectors[vectorInfo.index];
            left_ttsum += m_weightedDotProducts[vectorInfo.index];
            left_weight += vectorInfo.weight;
            m_vectorsInfoLeft[left_info_index++] = vectorInfo;
          } else {
            new_right_child += m_weightedVectors[vectorInfo.index];
            right_ttsum += m_weightedDotProducts[vectorInfo.index];
            right_weight += vectorInfo.weight;
            m_vectorsInfoRight[right_info_index++] = vectorInfo;
          }
        }
      } else {
        for (uint i = parent_node.m_begin; i < parent_node.m_end; i++) {
          const VectorInfo& vectorInfo = m_vectorsInfo[i];
          double left_dist2 = left_child.squared_distance(m_vectors[vectorInfo.index]);
          double right_dist2 = right_child.squared_distance(m_vectors[vectorInfo.index]);
          if (left_dist2 < right_dist2) {
            new_left_child += m_weightedVectors[vectorInfo.index];
            left_ttsum += m_weightedDotProducts[vectorInfo.index];
            left_weight += vectorInfo.weight;
            m_vectorsInfoLeft[left_info_index++] = vectorInfo;
          } else {
            new_right_child += m_weightedVectors[vectorInfo.index];
            right_ttsum += m_weightedDotProducts[vectorInfo.index];
            right_weight += vectorInfo.weight;
            m_vectorsInfoRight[right_info_index++] = vectorInfo;
          }
        }
      }

      if ((!left_weight) || (!right_weight)) {
        parent_node.m_unsplittable = true;
        return true;
      }

      left_variance = (float)(left_ttsum - (new_left_child.dot(new_left_child) / left_weight));
      right_variance = (float)(right_ttsum - (new_right_child.dot(new_right_child) / right_weight));

      new_left_child *= (1.0f / left_weight);
      new_right_child *= (1.0f / right_weight);

      left_child = new_left_child;
      right_child = new_right_child;

      float total_variance = left_variance + right_variance;
      if (total_variance < .00001f)
        break;

      if (((prev_total_variance - total_variance) / total_variance) < .00001f)
        break;

      prev_total_variance = total_variance;
    }

    parent_node.m_left = end_node++;
    parent_node.m_right = end_node++;

    node_queue.push(NodeInfo(parent_node.m_left, left_variance));
    node_queue.push(NodeInfo(parent_node.m_right, right_variance));

    vq_node& left_child_node = m_nodes[parent_node.m_left];
    vq_node& right_child_node = m_nodes[parent_node.m_right];

    left_child_node.m_begin = parent_node.m_begin;
    left_child_node.m_end = right_child_node.m_begin = left_info_index;
    right_child_node.m_end = parent_node.m_end;

    memcpy(&m_vectorsInfo[left_child_node.m_begin], &m_vectorsInfoLeft[parent_node.m_begin], (left_child_node.m_end - left_child_node.m_begin) * sizeof(VectorInfo));
    memcpy(&m_vectorsInfo[right_child_node.m_begin], &m_vectorsInfoRight[parent_node.m_begin], (right_child_node.m_end - right_child_node.m_begin) * sizeof(VectorInfo));

    left_child_node.m_centroid = left_child;
    left_child_node.m_total_weight = left_weight;
    left_child_node.m_variance = left_variance;

    right_child_node.m_centroid = right_child;
    right_child_node.m_total_weight = right_weight;
    right_child_node.m_variance = right_variance;

    return true;
  }